

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::addOutOfBlockDecl
          (Compilation *this,Scope *scope,ScopedNameSyntax *name,SyntaxNode *syntax,
          SymbolIndex index)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  byte bVar10;
  uint uVar11;
  Info *pIVar12;
  Diagnostic *this_00;
  ulong uVar13;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  *__u;
  long lVar14;
  ulong uVar15;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ulong pos0;
  ulong hash;
  undefined1 auVar16 [16];
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  string_view fmt;
  string_view sVar33;
  string_view sVar34;
  SourceRange range;
  SourceRange sourceRange;
  format_args args;
  try_emplace_args_t local_121;
  ScopedNameSyntax *local_120;
  Compilation *local_118;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
  *local_110;
  locator res;
  char *local_b8;
  Info *local_a8;
  tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  local_a0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  local_88;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_120 = (ScopedNameSyntax *)CONCAT44(local_120._4_4_,index);
  local_118 = (Compilation *)syntax;
  local_88.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  ._0_16_ = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(name->left).ptr);
  sVar33 = parsing::Token::valueText((Token *)&local_88);
  local_88.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  ._0_16_ = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(name->right).ptr);
  sVar34 = parsing::Token::valueText((Token *)&local_88);
  pIVar12 = (Info *)sVar34._M_len;
  local_110 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
               *)&this->outOfBlockDecls;
  local_88.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (size_t)pIVar12;
  local_88.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
  super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)
       (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)scope;
  local_a0.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>.
  super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.super__Tuple_impl<3UL,_bool>.
  super__Head_base<3UL,_bool,_false>._M_head_impl = (_Head_base<3UL,_bool,_false>)false;
  local_a0.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>.
  super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.
  super__Head_base<2UL,_slang::ast::SymbolIndex,_false>._M_head_impl = (SymbolIndex)local_120;
  local_a0.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl =
       (SyntaxNode *)local_118;
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  local_120 = name;
  local_a0.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>.
  super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>._M_head_impl = name;
  local_88.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = sVar34._M_str;
  local_88.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl
       = sVar33;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply((size_t *)&res,&local_88);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_88.
                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .
                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                 super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0) ^
                 SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8)) +
                 ((ulong)res.pg >> 2) + (long)res.pg * 0x40 + 0x9e3779b9 ^ (ulong)res.pg;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->outOfBlockDecls).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  lVar14 = (hash & 0xff) * 4;
  uVar17 = (&UNK_00474b6c)[lVar14];
  uVar18 = (&UNK_00474b6d)[lVar14];
  uVar19 = (&UNK_00474b6e)[lVar14];
  bVar20 = (&UNK_00474b6f)[lVar14];
  uVar13 = 0;
  uVar15 = pos0;
  uVar21 = uVar17;
  uVar22 = uVar18;
  uVar23 = uVar19;
  bVar24 = bVar20;
  uVar25 = uVar17;
  uVar26 = uVar18;
  uVar27 = uVar19;
  bVar28 = bVar20;
  uVar29 = uVar17;
  uVar30 = uVar18;
  uVar31 = uVar19;
  bVar32 = bVar20;
  do {
    local_b8 = sVar33._M_str;
    local_a8 = (Info *)sVar33._M_len;
    pgVar3 = (this->outOfBlockDecls).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
             .arrays.groups_;
    pgVar2 = pgVar3 + uVar15;
    local_48 = pgVar2->m[0].n;
    uStack_47 = pgVar2->m[1].n;
    uStack_46 = pgVar2->m[2].n;
    bStack_45 = pgVar2->m[3].n;
    uStack_44 = pgVar2->m[4].n;
    uStack_43 = pgVar2->m[5].n;
    uStack_42 = pgVar2->m[6].n;
    bStack_41 = pgVar2->m[7].n;
    uStack_40 = pgVar2->m[8].n;
    uStack_3f = pgVar2->m[9].n;
    uStack_3e = pgVar2->m[10].n;
    bStack_3d = pgVar2->m[0xb].n;
    uStack_3c = pgVar2->m[0xc].n;
    uStack_3b = pgVar2->m[0xd].n;
    uStack_3a = pgVar2->m[0xe].n;
    bVar10 = pgVar2->m[0xf].n;
    auVar16[0] = -(local_48 == uVar17);
    auVar16[1] = -(uStack_47 == uVar18);
    auVar16[2] = -(uStack_46 == uVar19);
    auVar16[3] = -(bStack_45 == bVar20);
    auVar16[4] = -(uStack_44 == uVar21);
    auVar16[5] = -(uStack_43 == uVar22);
    auVar16[6] = -(uStack_42 == uVar23);
    auVar16[7] = -(bStack_41 == bVar24);
    auVar16[8] = -(uStack_40 == uVar25);
    auVar16[9] = -(uStack_3f == uVar26);
    auVar16[10] = -(uStack_3e == uVar27);
    auVar16[0xb] = -(bStack_3d == bVar28);
    auVar16[0xc] = -(uStack_3c == uVar29);
    auVar16[0xd] = -(uStack_3b == uVar30);
    auVar16[0xe] = -(uStack_3a == uVar31);
    auVar16[0xf] = -(bVar10 == bVar32);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
    bStack_39 = bVar10;
    if (uVar11 != 0) {
      ppVar4 = (this->outOfBlockDecls).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
               .arrays.elements_;
      local_118 = this;
      local_58 = uVar17;
      uStack_57 = uVar18;
      uStack_56 = uVar19;
      bStack_55 = bVar20;
      uStack_54 = uVar21;
      uStack_53 = uVar22;
      uStack_52 = uVar23;
      bStack_51 = bVar24;
      uStack_50 = uVar25;
      uStack_4f = uVar26;
      uStack_4e = uVar27;
      bStack_4d = bVar28;
      uStack_4c = uVar29;
      uStack_4b = uVar30;
      uStack_4a = uVar31;
      bStack_49 = bVar32;
      do {
        iVar6 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        __u = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
               *)((long)&ppVar4[uVar15 * 0xf].first.
                         super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         .
                         super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                         .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                         super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
                 (ulong)(uint)(iVar6 << 6));
        bVar9 = std::
                __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_3UL>
                ::__eq(&local_88,__u);
        if (bVar9) {
          if (pIVar12 == (Info *)0x0 || local_a8 == (Info *)0x0) {
            return;
          }
          local_88.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .
          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len = (size_t)local_a8;
          local_88.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .
          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
          super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
               (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)
               (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)local_b8;
          fmt.size_ = 0xdd;
          fmt.data_ = (char *)0x6;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)&local_88;
          local_88.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .
          super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_str = sVar34._M_str;
          local_88.
          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
          .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
          _M_head_impl._M_len = (size_t)pIVar12;
          ::fmt::v11::vformat_abi_cxx11_((string *)&res,(v11 *)"{}::{}",fmt,args);
          range = slang::syntax::SyntaxNode::sourceRange
                            ((SyntaxNode *)
                             __u[1].
                             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                             .
                             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                             .
                             super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                             ._M_head_impl._M_len);
          sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_120);
          this_00 = Scope::addDiag(scope,(DiagCode)0x2a000a,sourceRange);
          Diagnostic::operator<<(this_00,(string *)&res);
          Diagnostic::addNote(this_00,(DiagCode)0xa0001,range);
          if (res.pg == (group15<boost::unordered::detail::foa::plain_integral> *)&res.p) {
            return;
          }
          operator_delete(res.pg,(size_t)((long)&((res.p)->first).
                                                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                                 .
                                                 super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                                 .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                                                 super__Head_base<2UL,_const_slang::ast::Scope_*,_false>
                                                 ._M_head_impl + 1));
          return;
        }
        uVar11 = uVar11 - 1 & uVar11;
      } while (uVar11 != 0);
      bVar10 = pgVar3[uVar15].m[0xf].n;
      this = local_118;
      uVar17 = local_58;
      uVar18 = uStack_57;
      uVar19 = uStack_56;
      bVar20 = bStack_55;
      uVar21 = uStack_54;
      uVar22 = uStack_53;
      uVar23 = uStack_52;
      bVar24 = bStack_51;
      uVar25 = uStack_50;
      uVar26 = uStack_4f;
      uVar27 = uStack_4e;
      bVar28 = bStack_4d;
      uVar29 = uStack_4c;
      uVar30 = uStack_4b;
      uVar31 = uStack_4a;
      bVar32 = bStack_49;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar10) == 0) break;
    uVar5 = (this->outOfBlockDecls).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar14 = uVar15 + uVar13;
    uVar13 = uVar13 + 1;
    uVar15 = lVar14 + 1U & uVar5;
  } while (uVar13 <= uVar5);
  if ((this->outOfBlockDecls).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      .size_ctrl.size <
      (this->outOfBlockDecls).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>
              (&res,local_110,(arrays_type *)local_110,pos0,hash,&local_121,&local_88,&local_a0);
    psVar1 = &(this->outOfBlockDecls).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>
              (&res,local_110,hash,&local_121,&local_88,&local_a0);
  }
  return;
}

Assistant:

void Compilation::addOutOfBlockDecl(const Scope& scope, const ScopedNameSyntax& name,
                                    const SyntaxNode& syntax, SymbolIndex index) {
    SLANG_ASSERT(!isFrozen());

    std::string_view className = name.left->getLastToken().valueText();
    std::string_view declName = name.right->getLastToken().valueText();
    auto [it, inserted] = outOfBlockDecls.emplace(std::make_tuple(className, declName, &scope),
                                                  std::make_tuple(&syntax, &name, index, false));

    if (!inserted && !className.empty() && !declName.empty()) {
        std::string combined = fmt::format("{}::{}", className, declName);
        auto range = std::get<1>(it->second)->sourceRange();

        auto& diag = scope.addDiag(diag::Redefinition, name.sourceRange());
        diag << combined;
        diag.addNote(diag::NotePreviousDefinition, range);
    }
}